

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_encoding.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::pixie::FieldEncodingMethods::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FieldEncodingMethods *this,
          FieldEncodingEnum field_encoding)

{
  invalid_argument *this_00;
  undefined7 in_register_00000011;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [19];
  allocator<char> local_12;
  byte local_11;
  string *psStack_10;
  FieldEncodingEnum field_encoding_local;
  
  local_11 = (byte)this;
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NOT_DEFINED",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  default:
    this_00 = (invalid_argument *)
              __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,field_encoding));
    std::__cxx11::to_string(&local_d0,(uint)local_11);
    std::operator+(&local_b0,"unrecognised field encoding code: ",&local_d0);
    std::operator+(&local_90,&local_b0," (\'");
    std::operator+(&local_70,&local_90,local_11);
    std::operator+(&local_50,&local_70,"\').");
    std::invalid_argument::invalid_argument(this_00,(string *)&local_50);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case 0x30:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NOOP",&local_12);
    std::allocator<char>::~allocator(&local_12);
    break;
  case 0x31:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FIXED1",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 0x32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FIXED2",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 0x33:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FIXED3",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 0x34:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FIXED4",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 0x38:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FIXED8",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 0x40:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FIXED16",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 0x42:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_ARRAY",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 0x53:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"VARINT_STRING",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
    break;
  case 0x56:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"VARINT",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 0x5a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ZIGZAG",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldEncodingMethods::ToString(FieldEncodingEnum field_encoding)
{
    switch (field_encoding)
    {
        case FieldEncodingEnum::NOOP:
            return "NOOP";
        case FieldEncodingEnum::FIXED1:
            return "FIXED1";
        case FieldEncodingEnum::FIXED2:
            return "FIXED2";
        case FieldEncodingEnum::FIXED3:
            return "FIXED3";
        case FieldEncodingEnum::FIXED4:
            return "FIXED4";
        case FieldEncodingEnum::FIXED8:
            return "FIXED8";
        case FieldEncodingEnum::FIXED16:
            return "FIXED16";
        case FieldEncodingEnum::BYTE_ARRAY:
            return "BYTE_ARRAY";
        case FieldEncodingEnum::VARINT:
            return "VARINT";
        case FieldEncodingEnum::VARINT_STRING:
            return "VARINT_STRING";
        case FieldEncodingEnum::ZIGZAG:
            return "ZIGZAG";
        case FieldEncodingEnum::NOT_DEFINED:
            return "NOT_DEFINED";
        default:
            throw std::invalid_argument("unrecognised field encoding code: " +
                                        std::to_string(field_encoding) + " ('" + (char) field_encoding + "').");
    }
}